

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_currency.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::CombinedCurrencyMatcher::CombinedCurrencyMatcher
          (CombinedCurrencyMatcher *this,CurrencySymbols *currencySymbols,DecimalFormatSymbols *dfs,
          parse_flags_t parseFlags,UErrorCode *status)

{
  UnicodeString *pUVar1;
  char *s;
  char16_t *src;
  UnicodeString *local_188;
  UnicodeString local_168;
  Form local_128;
  Form local_124;
  Form plural;
  int32_t i;
  UErrorCode *local_30;
  UErrorCode *status_local;
  DecimalFormatSymbols *pDStack_20;
  parse_flags_t parseFlags_local;
  DecimalFormatSymbols *dfs_local;
  CurrencySymbols *currencySymbols_local;
  CombinedCurrencyMatcher *this_local;
  
  local_30 = status;
  status_local._4_4_ = parseFlags;
  pDStack_20 = dfs;
  dfs_local = (DecimalFormatSymbols *)currencySymbols;
  currencySymbols_local = (CurrencySymbols *)this;
  NumberParseMatcher::NumberParseMatcher(&this->super_NumberParseMatcher);
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__CombinedCurrencyMatcher_004a14c8;
  icu_63::number::impl::CurrencySymbols::getCurrencySymbol
            (&this->fCurrency1,(CurrencySymbols *)dfs_local,local_30);
  icu_63::number::impl::CurrencySymbols::getIntlCurrencySymbol
            (&this->fCurrency2,(CurrencySymbols *)dfs_local,local_30);
  this->fUseFullCurrencyData = (status_local._4_4_ & 0x2000) == 0;
  local_188 = (UnicodeString *)&this->field_0x98;
  do {
    UnicodeString::UnicodeString(local_188);
    local_188 = local_188 + 1;
  } while (local_188 != &this->afterPrefixInsert);
  pUVar1 = DecimalFormatSymbols::getPatternForCurrencySpacing
                     (pDStack_20,UNUM_CURRENCY_INSERT,'\0',local_30);
  UnicodeString::UnicodeString(&this->afterPrefixInsert,pUVar1);
  pUVar1 = DecimalFormatSymbols::getPatternForCurrencySpacing
                     (pDStack_20,UNUM_CURRENCY_INSERT,'\x01',local_30);
  UnicodeString::UnicodeString(&this->beforeSuffixInsert,pUVar1);
  DecimalFormatSymbols::getLocale((Locale *)&plural,pDStack_20);
  s = Locale::getName((Locale *)&plural);
  CharString::CharString(&this->fLocaleName,s,-1,local_30);
  Locale::~Locale((Locale *)&plural);
  src = icu_63::number::impl::CurrencySymbols::getIsoCode((CurrencySymbols *)dfs_local);
  utils::copyCurrencyCode(this->fCurrencyCode,src);
  if ((this->fUseFullCurrencyData & 1U) == 0) {
    for (local_124 = ZERO; (int)local_124 < 6; local_124 = local_124 + ONE) {
      local_128 = local_124;
      icu_63::number::impl::CurrencySymbols::getPluralName
                (&local_168,(CurrencySymbols *)dfs_local,local_124,local_30);
      UnicodeString::operator=
                ((UnicodeString *)(&this->field_0x98 + (long)(int)local_124 * 0x40),&local_168);
      UnicodeString::~UnicodeString(&local_168);
    }
  }
  return;
}

Assistant:

CombinedCurrencyMatcher::CombinedCurrencyMatcher(const CurrencySymbols& currencySymbols, const DecimalFormatSymbols& dfs,
                                                 parse_flags_t parseFlags, UErrorCode& status)
        : fCurrency1(currencySymbols.getCurrencySymbol(status)),
          fCurrency2(currencySymbols.getIntlCurrencySymbol(status)),
          fUseFullCurrencyData(0 == (parseFlags & PARSE_FLAG_NO_FOREIGN_CURRENCY)),
          afterPrefixInsert(dfs.getPatternForCurrencySpacing(UNUM_CURRENCY_INSERT, false, status)),
          beforeSuffixInsert(dfs.getPatternForCurrencySpacing(UNUM_CURRENCY_INSERT, true, status)),
          fLocaleName(dfs.getLocale().getName(), -1, status) {
    utils::copyCurrencyCode(fCurrencyCode, currencySymbols.getIsoCode());

    // Pre-load the long names for the current locale and currency
    // if we are parsing without the full currency data.
    if (!fUseFullCurrencyData) {
        for (int32_t i=0; i<StandardPlural::COUNT; i++) {
            auto plural = static_cast<StandardPlural::Form>(i);
            fLocalLongNames[i] = currencySymbols.getPluralName(plural, status);
        }
    }

    // TODO: Figure out how to make this faster and re-enable.
    // Computing the "lead code points" set for fastpathing is too slow to use in production.
    // See http://bugs.icu-project.org/trac/ticket/13584
//    // Compute the full set of characters that could be the first in a currency to allow for
//    // efficient smoke test.
//    fLeadCodePoints.add(fCurrency1.char32At(0));
//    fLeadCodePoints.add(fCurrency2.char32At(0));
//    fLeadCodePoints.add(beforeSuffixInsert.char32At(0));
//    uprv_currencyLeads(fLocaleName.data(), fLeadCodePoints, status);
//    // Always apply case mapping closure for currencies
//    fLeadCodePoints.closeOver(USET_ADD_CASE_MAPPINGS);
//    fLeadCodePoints.freeze();
}